

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::VerifyLargeAllocZeroFill
          (Recycler *this,void *address,size_t size,ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DummyVTableObject local_30;
  DummyVTableObject dummy;
  size_t sStack_20;
  ObjectInfoBits attributes_local;
  size_t size_local;
  void *address_local;
  Recycler *this_local;
  
  dummy.super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject._6_2_ =
       attributes;
  sStack_20 = size;
  size_local = (size_t)address;
  if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
    DummyVTableObject::DummyVTableObject(&local_30);
    if (local_30.super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        != (FinalizableObject)*address) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1e82,"((*(void**)(&dummy)) == *((void**)address))",
                         "(*(void**)(&dummy)) == *((void**)address)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    size_local = (long)address + 8;
    sStack_20 = size - 8;
  }
  VerifyZeroFill(this,(void *)size_local,sStack_20);
  return;
}

Assistant:

void
Recycler::VerifyLargeAllocZeroFill(void * address, size_t size, ObjectInfoBits attributes)
{
    // Large allocs will have already written the dummy vtable at the beginning of the allocation
    // if either FinalizeBit or TrackBit attributes were set. Skip the verify for that memory
    // if that is the case.
    if ((attributes & (FinalizeBit | TrackBit)) != 0)
    {
        // Verify that it really is the dummy v-table before skipping it.
        DummyVTableObject dummy;
        Assert((*(void**)(&dummy)) == *((void**)address));

        address = ((char*)address) + sizeof(DummyVTableObject);
        size -= sizeof(DummyVTableObject);
    }
    VerifyZeroFill(address, size);
}